

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O1

size_t slang::parsing::getExtraSize(TokenKind kind)

{
  int iVar1;
  undefined6 in_register_0000003a;
  
  iVar1 = (int)CONCAT62(in_register_0000003a,kind);
  if (iVar1 < 0x157) {
    switch(iVar1) {
    case 3:
    case 7:
    case 8:
    case 9:
      goto switchD_002987a3_caseD_3;
    case 4:
    case 5:
      return 0x10;
    default:
      return 0;
    }
  }
  if (iVar1 != 0x157) {
    if (iVar1 == 0x158) {
      return 0x10;
    }
    if (iVar1 != 0x159) {
      return 0;
    }
  }
switchD_002987a3_caseD_3:
  return 8;
}

Assistant:

static constexpr size_t getExtraSize(TokenKind kind) {
    size_t size = 0;
    switch (kind) {
        case TokenKind::StringLiteral:
        case TokenKind::IncludeFileName:
            size = sizeof(std::string_view);
            break;
        case TokenKind::RealLiteral:
        case TokenKind::TimeLiteral:
            size = sizeof(double);
            break;
        case TokenKind::IntegerLiteral:
            size = sizeof(SVIntStorage);
            break;
        case TokenKind::UnbasedUnsizedLiteral:
            size = sizeof(logic_t);
            break;
        case TokenKind::Directive:
        case TokenKind::MacroUsage:
            size = sizeof(SyntaxKind);
            break;
        case TokenKind::SystemIdentifier:
            size = sizeof(KnownSystemName);
            break;
        default:
            return 0;
    }

    size_t align = alignof(void*);
    return (size + align - 1) & ~(align - 1);
}